

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sniff_csv.cpp
# Opt level: O2

void __thiscall duckdb::CSVSniffFunctionData::~CSVSniffFunctionData(CSVSniffFunctionData *this)

{
  ~CSVSniffFunctionData(this);
  operator_delete(this);
  return;
}

Assistant:

CSVSniffFunctionData() {
	}